

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_encoder_rtc.cc
# Opt level: O2

void write_literal(aom_write_bit_buffer *wb,uint32_t data,uint8_t bits,uint32_t offset)

{
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  uint uVar1;
  
  if (0x20 < bits) {
    die("Invalid bits value %d > 32\n",CONCAT71(in_register_00000011,bits) & 0xffffffff);
  }
  uVar1 = ~(uint)(-1L << (bits & 0x3f));
  if ((offset <= data) && (data - offset <= uVar1)) {
    aom_wb_write_unsigned_literal(wb,data - offset,(int)CONCAT71(in_register_00000011,bits));
    return;
  }
  die("Invalid data, value %u out of range [%u, %lu]\n",CONCAT44(in_register_00000034,data),
      (ulong)offset,(ulong)offset + (ulong)uVar1);
}

Assistant:

static void write_literal(struct aom_write_bit_buffer *wb, uint32_t data,
                          uint8_t bits, uint32_t offset = 0) {
  if (bits > 32) {
    die("Invalid bits value %d > 32\n", bits);
  }
  const uint32_t max = static_cast<uint32_t>(((uint64_t)1 << bits) - 1);
  if (data < offset || (data - offset) > max) {
    die("Invalid data, value %u out of range [%u, %" PRIu64 "]\n", data, offset,
        (uint64_t)max + offset);
  }
  aom_wb_write_unsigned_literal(wb, data - offset, bits);
}